

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O1

void JsStandardConstruct(JsObject *self,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  JsObject *pJVar1;
  undefined1 local_50 [8];
  JsValue res0;
  
  res0.u.reference.name = (char *)argv;
  pJVar1 = JsCreateBaseObject((JsObject *)0x0,0,0,(JsList)0x0);
  (*self->Get)(self,"prototype",(int *)0x0,(JsValue *)local_50);
  if (local_50._0_4_ == JS_OBJECT) {
    pJVar1->Prototype = (JsObject *)res0._0_8_;
  }
  (*self->Call)(self,pJVar1,argc,(JsValue **)res0.u.reference.name,res);
  if (res->type != JS_OBJECT) {
    res->type = JS_OBJECT;
    (res->u).object = pJVar1;
  }
  return;
}

Assistant:

void JsStandardConstruct(struct JsObject *self, struct JsObject *thisobj,
			int argc, struct JsValue **argv, struct JsValue *res){
			
	struct JsObject* this0 = JsCreateStandardObject(NULL);
	struct JsValue res0;
	//获得构造函数的prototype属性
	(*self->Get)(self,"prototype",NULL,&res0);
	if(res0.type == JS_OBJECT)
		this0->Prototype = res0.u.object;
	//Call
	(*self->Call)(self,this0,argc,argv,res);
	if(res->type != JS_OBJECT){
		res->type = JS_OBJECT;
		res->u.object = this0;
	}
}